

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhap_parser_test.cpp
# Opt level: O2

void __thiscall
bioparser::test::BioparserMhapTest_ParseWhole_Test::~BioparserMhapTest_ParseWhole_Test
          (BioparserMhapTest_ParseWhole_Test *this)

{
  BioparserMhapTest::~BioparserMhapTest(&this->super_BioparserMhapTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(BioparserMhapTest, ParseWhole) {
  Setup("sample.mhap");
  o = p->Parse(-1);
  Check();
}